

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O3

wchar_t project_path(chunk *c,loc *gp,wchar_t range,loc grid1,loc grid2,wchar_t flg)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  loc grid2_00;
  loc lVar4;
  loc_conflict lVar5;
  square *psVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar11;
  short sVar12;
  long lVar13;
  long lVar14;
  wchar_t x;
  uint uVar15;
  uint uVar16;
  int iVar18;
  int iVar19;
  int iVar20;
  int x_00;
  ulong uVar21;
  wchar_t y;
  int iVar22;
  long local_a8;
  int local_98;
  wchar_t wVar10;
  wchar_t wVar17;
  
  grid2_00 = cave_find_decoy((chunk_conflict *)c);
  _Var2 = loc_eq((loc_conflict)grid1,(loc_conflict)grid2);
  if (_Var2) {
    return L'\0';
  }
  wVar17 = grid2.y;
  y = grid1.y;
  uVar16 = wVar17 - y;
  iVar20 = (uint)(y <= wVar17) * 2 + -1;
  uVar15 = -uVar16;
  if (0 < (int)uVar16) {
    uVar15 = uVar16;
  }
  wVar10 = grid2.x;
  x = grid1.x;
  uVar9 = wVar10 - x;
  iVar7 = (uint)(x <= wVar10) * 2 + -1;
  uVar8 = -uVar9;
  if (0 < (int)uVar9) {
    uVar8 = uVar9;
  }
  iVar11 = uVar15 * uVar8;
  sVar12 = (short)flg;
  if (uVar8 < uVar15) {
    iVar18 = iVar20 + y;
    lVar4 = (loc)loc(x,iVar18);
    *gp = lVar4;
    if (range < L'\x02') {
      return L'\x01';
    }
    iVar3 = uVar9 * uVar9;
    iVar1 = iVar3 * 2;
    iVar22 = y + iVar20 * 2;
    iVar19 = 0;
    uVar21 = (ulong)grid1 & 0xffffffff;
    lVar13 = 1;
    do {
      x_00 = (int)uVar21;
      if ((flg & 4U) == 0) {
        lVar5 = loc(x_00,iVar18);
        _Var2 = loc_eq(lVar5,(loc_conflict)grid2);
        if (_Var2) goto LAB_001c9c0e;
      }
      if (-1 < sVar12) {
        lVar4 = (loc)loc(x_00,iVar18);
        if (((uint)flg >> 0xc & 1) == 0) {
          _Var2 = square_isprojectable((chunk_conflict *)c,lVar4);
          if (!_Var2) goto LAB_001c9c0e;
        }
        else {
          _Var2 = square_isbelievedwall((chunk_conflict *)c,lVar4);
          if (_Var2) goto LAB_001c9c0e;
        }
      }
      if ((flg & 8U) != 0) {
        lVar4 = (loc)loc(x_00,iVar18);
        psVar6 = square((chunk_conflict *)c,lVar4);
        if (psVar6->mon != 0) {
LAB_001c9c0e:
          return (wchar_t)lVar13;
        }
        lVar5 = loc(x_00,iVar18);
        _Var2 = loc_eq(lVar5,(loc_conflict)grid2_00);
        if (_Var2) goto LAB_001c9c0e;
      }
      if ((wVar10 != x) && (iVar3 = iVar3 + iVar1, iVar11 <= iVar3)) {
        uVar21 = (ulong)(uint)(x_00 + iVar7);
        iVar3 = iVar3 + iVar11 * -2;
        iVar19 = iVar19 + 1;
      }
      iVar18 = iVar18 + iVar20;
      lVar14 = lVar13 + 1;
      lVar4 = (loc)loc((int)uVar21,iVar22);
      gp[lVar13] = lVar4;
      iVar22 = iVar22 + iVar20;
      lVar13 = lVar14;
    } while ((iVar19 >> 1) + (int)lVar14 < range);
  }
  else {
    if (uVar8 <= uVar15) {
      local_98 = iVar20 + y;
      iVar11 = iVar7 + x;
      lVar4 = (loc)loc(iVar11,local_98);
      *gp = lVar4;
      if (range < L'\x02') {
        return L'\x01';
      }
      iVar18 = y + iVar20 * 2;
      iVar19 = x + iVar7 * 2;
      uVar15 = 1;
      local_a8 = 0;
      do {
        if ((flg & 4U) == 0) {
          lVar5 = loc(iVar11,local_98);
          _Var2 = loc_eq(lVar5,(loc_conflict)grid2);
          if (_Var2) break;
        }
        if (-1 < sVar12) {
          lVar4 = (loc)loc(iVar11,local_98);
          if (((uint)flg >> 0xc & 1) == 0) {
            _Var2 = square_isprojectable((chunk_conflict *)c,lVar4);
            if (!_Var2) break;
          }
          else {
            _Var2 = square_isbelievedwall((chunk_conflict *)c,lVar4);
            if (_Var2) break;
          }
        }
        if ((flg & 8U) != 0) {
          lVar4 = (loc)loc(iVar11,local_98);
          psVar6 = square((chunk_conflict *)c,lVar4);
          if (psVar6->mon != 0) break;
          lVar5 = loc(iVar11,local_98);
          _Var2 = loc_eq(lVar5,(loc_conflict)grid2_00);
          if (_Var2) break;
        }
        local_98 = local_98 + iVar20;
        iVar11 = iVar11 + iVar7;
        lVar4 = (loc)loc(iVar19,iVar18);
        gp[local_a8 + 1] = lVar4;
        local_a8 = local_a8 + 1;
        uVar15 = uVar15 + 1;
        iVar18 = iVar18 + iVar20;
        iVar19 = iVar19 + iVar7;
      } while ((uVar15 >> 1) + (int)local_a8 + L'\x01' < range);
      return (int)local_a8 + L'\x01';
    }
    iVar18 = iVar7 + x;
    lVar4 = (loc)loc(iVar18,y);
    *gp = lVar4;
    if (range < L'\x02') {
      return L'\x01';
    }
    iVar3 = uVar16 * uVar16;
    iVar1 = iVar3 * 2;
    iVar22 = x + iVar7 * 2;
    iVar19 = 0;
    lVar13 = 1;
    local_a8._0_4_ = y;
    do {
      if ((flg & 4U) == 0) {
        lVar5 = loc(iVar18,(wchar_t)local_a8);
        _Var2 = loc_eq(lVar5,(loc_conflict)grid2);
        if (_Var2) goto LAB_001c9c17;
      }
      if (-1 < sVar12) {
        lVar4 = (loc)loc(iVar18,(wchar_t)local_a8);
        if (((uint)flg >> 0xc & 1) == 0) {
          _Var2 = square_isprojectable((chunk_conflict *)c,lVar4);
          if (!_Var2) goto LAB_001c9c17;
        }
        else {
          _Var2 = square_isbelievedwall((chunk_conflict *)c,lVar4);
          if (_Var2) goto LAB_001c9c17;
        }
      }
      if ((flg & 8U) != 0) {
        lVar4 = (loc)loc(iVar18,(wchar_t)local_a8);
        psVar6 = square((chunk_conflict *)c,lVar4);
        if (psVar6->mon != 0) {
LAB_001c9c17:
          return (wchar_t)lVar13;
        }
        lVar5 = loc(iVar18,(wchar_t)local_a8);
        _Var2 = loc_eq(lVar5,(loc_conflict)grid2_00);
        if (_Var2) goto LAB_001c9c17;
      }
      if ((wVar17 != y) && (iVar3 = iVar3 + iVar1, iVar11 <= iVar3)) {
        local_a8._0_4_ = (wchar_t)local_a8 + iVar20;
        iVar3 = iVar3 + iVar11 * -2;
        iVar19 = iVar19 + 1;
      }
      iVar18 = iVar18 + iVar7;
      lVar14 = lVar13 + 1;
      lVar4 = (loc)loc(iVar22,(wchar_t)local_a8);
      gp[lVar13] = lVar4;
      iVar22 = iVar22 + iVar7;
      lVar13 = lVar14;
    } while ((iVar19 >> 1) + (int)lVar14 < range);
  }
  return (wchar_t)lVar14;
}

Assistant:

int project_path(struct chunk *c, struct loc *gp, int range, struct loc grid1,
				 struct loc grid2, int flg)
{
	int y, x;

	int n = 0;
	int k = 0;

	/* Absolute */
	int ay, ax;

	/* Offsets */
	int sy, sx;

	/* Fractions */
	int frac;

	/* Scale factors */
	int full, half;

	/* Slope */
	int m;

	/* Possible decoy */
	struct loc decoy = cave_find_decoy(c);

	/* No path necessary (or allowed) */
	if (loc_eq(grid1, grid2)) return (0);


	/* Analyze "dy" */
	if (grid2.y < grid1.y) {
		ay = (grid1.y - grid2.y);
		sy = -1;
	} else {
		ay = (grid2.y - grid1.y);
		sy = 1;
	}

	/* Analyze "dx" */
	if (grid2.x < grid1.x) {
		ax = (grid1.x - grid2.x);
		sx = -1;
	} else {
		ax = (grid2.x - grid1.x);
		sx = 1;
	}


	/* Number of "units" in one "half" grid */
	half = (ay * ax);

	/* Number of "units" in one "full" grid */
	full = half << 1;


	/* Vertical */
	if (ay > ax) {
		/* Start at tile edge */
		frac = ax * ax;

		/* Let m = ((dx/dy) * full) = (dx * dx * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y + sy;
		x = grid1.x;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (X) part 1 */
				frac += m;

				/* Horizontal change */
				if (frac >= half) {
					/* Advance (X) part 2 */
					x += sx;

					/* Advance (X) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (Y) */
			y += sy;
		}
	}

	/* Horizontal */
	else if (ax > ay) {
		/* Start at tile edge */
		frac = ay * ay;

		/* Let m = ((dy/dx) * full) = (dy * dy * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (Y) part 1 */
				frac += m;

				/* Vertical change */
				if (frac >= half) {
					/* Advance (Y) part 2 */
					y += sy;

					/* Advance (Y) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (X) */
			x += sx;
		}
	}

	/* Diagonal */
	else {
		/* Start */
		y = grid1.y + sy;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (n >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Advance */
			y += sy;
			x += sx;
		}
	}

	/* Length */
	return (n);
}